

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_sparse_new.cpp
# Opt level: O1

void __thiscall matrix_sparse_row_test_at_Test::TestBody(matrix_sparse_row_test_at_Test *this)

{
  pointer piVar1;
  AssertHelper AVar2;
  AssertHelper AVar3;
  bool bVar4;
  bool bVar5;
  char cVar6;
  int iVar7;
  const_reference_value pdVar8;
  char *pcVar9;
  long lVar10;
  StringLike<const_char_*> *regex;
  StringLike<const_char_*> *regex_00;
  StringLike<const_char_*> *regex_01;
  DeathTest *gtest_dt;
  AssertionResult gtest_ar;
  Matrix_Sparse_Row<double,_int> row;
  AssertHelper local_d8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_d0;
  Message local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c0 [3];
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_a8;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_90;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_78;
  Matrix_Sparse_Row<double,_int> local_60;
  
  local_60.ptr_data = &(this->super_matrix_sparse_row_test).csr_data;
  piVar1 = (this->super_matrix_sparse_row_test).csr_data.row_offset.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  local_60.iter_row_offset._M_current = piVar1 + 2;
  lVar10 = (long)piVar1[2];
  local_60.i_column._M_ptr =
       (this->super_matrix_sparse_row_test).csr_data.i_column.
       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start +
       lVar10;
  local_60.i_column._M_extent._M_extent_value = piVar1[3] - lVar10;
  local_60.value._M_ptr =
       (this->super_matrix_sparse_row_test).csr_data.value.
       super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
       + lVar10;
  local_d0._M_head_impl._0_4_ = 1;
  local_60.value._M_extent._M_extent_value = local_60.i_column._M_extent._M_extent_value;
  pdVar8 = Disa::Matrix_Sparse_Row<double,_int>::at(&local_60,(index_type *)&local_d0);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&local_c8,"row.at(1)","3.0",*pdVar8,3.0);
  if (local_c8.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_d0);
    if (local_c0[0] == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (local_c0[0]->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
               ,0xfa,pcVar9);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if (local_d0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_d0._M_head_impl + 8))();
    }
  }
  if (local_c0[0] != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_c0,local_c0[0]);
  }
  local_d0._M_head_impl._0_4_ = 3;
  pdVar8 = Disa::Matrix_Sparse_Row<double,_int>::at(&local_60,(index_type *)&local_d0);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&local_c8,"row.at(3)","4.0",*pdVar8,4.0);
  if (local_c8.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_d0);
    if (local_c0[0] == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (local_c0[0]->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
               ,0xfb,pcVar9);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if (local_d0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_d0._M_head_impl + 8))();
    }
  }
  if (local_c0[0] != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_c0,local_c0[0]);
  }
  local_d0._M_head_impl._0_4_ = 4;
  pdVar8 = Disa::Matrix_Sparse_Row<double,_int>::at(&local_60,(index_type *)&local_d0);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&local_c8,"row.at(4)","5.0",*pdVar8,5.0);
  if (local_c8.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_d0);
    if (local_c0[0] == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (local_c0[0]->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
               ,0xfc,pcVar9);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if (local_d0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_d0._M_head_impl + 8))();
    }
  }
  if (local_c0[0] != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_c0,local_c0[0]);
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    local_d0._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x147416;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)&local_c8,
               (testing *)&local_d0,regex);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_78,(PolymorphicMatcher *)&local_c8);
    if (local_c0[0] != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0[0]);
    }
    bVar5 = testing::internal::DeathTest::Create
                      ("remove_warning = row.at(0)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_78,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
                       ,0xff,(DeathTest **)&local_d8);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_78);
    AVar2.data_ = local_d8.data_;
    bVar4 = true;
    if (bVar5) {
      if (local_d8.data_ != (AssertHelperData *)0x0) {
        iVar7 = (**(code **)(*(long *)local_d8.data_ + 0x10))(local_d8.data_);
        AVar3.data_ = local_d8.data_;
        if (iVar7 == 0) {
          iVar7 = (**(code **)(*(long *)local_d8.data_ + 0x18))(local_d8.data_);
          bVar4 = testing::internal::ExitedUnsuccessfully(iVar7);
          cVar6 = (**(code **)(*(long *)AVar3.data_ + 0x20))(AVar3.data_,bVar4);
          if (cVar6 != '\0') goto LAB_0010f828;
          bVar4 = true;
          bVar5 = false;
        }
        else {
          if (iVar7 == 1) {
            bVar4 = testing::internal::AlwaysTrue();
            if (bVar4) {
              local_c8.ss_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._0_4_ = 0;
              Disa::Matrix_Sparse_Row<double,_int>::at(&local_60,(index_type *)&local_c8);
            }
            (**(code **)(*(long *)local_d8.data_ + 0x28))(local_d8.data_,2);
            (**(code **)(*(long *)AVar3.data_ + 0x28))(AVar3.data_,0);
          }
LAB_0010f828:
          bVar4 = false;
          bVar5 = true;
        }
        (**(code **)(*(long *)AVar2.data_ + 8))(AVar2.data_);
        if (!bVar5) goto LAB_0010f83b;
      }
      bVar4 = false;
    }
LAB_0010f83b:
    if (bVar4) goto LAB_0010f83f;
  }
  else {
LAB_0010f83f:
    testing::Message::Message(&local_c8);
    pcVar9 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
               ,0xff,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_d0,&local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d0);
    if ((long *)CONCAT44(local_c8.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         local_c8.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_c8.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     local_c8.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_4_) + 8))();
    }
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    local_d0._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x147416;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)&local_c8,
               (testing *)&local_d0,regex_00);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_90,(PolymorphicMatcher *)&local_c8);
    if (local_c0[0] != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0[0]);
    }
    bVar5 = testing::internal::DeathTest::Create
                      ("remove_warning = row.at(2)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_90,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
                       ,0x100,(DeathTest **)&local_d8);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_90);
    AVar2.data_ = local_d8.data_;
    bVar4 = true;
    if (bVar5) {
      if (local_d8.data_ != (AssertHelperData *)0x0) {
        iVar7 = (**(code **)(*(long *)local_d8.data_ + 0x10))(local_d8.data_);
        AVar3.data_ = local_d8.data_;
        if (iVar7 == 0) {
          iVar7 = (**(code **)(*(long *)local_d8.data_ + 0x18))(local_d8.data_);
          bVar4 = testing::internal::ExitedUnsuccessfully(iVar7);
          cVar6 = (**(code **)(*(long *)AVar3.data_ + 0x20))(AVar3.data_,bVar4);
          if (cVar6 != '\0') goto LAB_0010f998;
          bVar4 = true;
          bVar5 = false;
        }
        else {
          if (iVar7 == 1) {
            bVar4 = testing::internal::AlwaysTrue();
            if (bVar4) {
              local_c8.ss_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._0_4_ = 2;
              Disa::Matrix_Sparse_Row<double,_int>::at(&local_60,(index_type *)&local_c8);
            }
            (**(code **)(*(long *)local_d8.data_ + 0x28))(local_d8.data_,2);
            (**(code **)(*(long *)AVar3.data_ + 0x28))(AVar3.data_,0);
          }
LAB_0010f998:
          bVar4 = false;
          bVar5 = true;
        }
        (**(code **)(*(long *)AVar2.data_ + 8))(AVar2.data_);
        if (!bVar5) goto LAB_0010f9ab;
      }
      bVar4 = false;
    }
LAB_0010f9ab:
    if (bVar4) goto LAB_0010f9af;
  }
  else {
LAB_0010f9af:
    testing::Message::Message(&local_c8);
    pcVar9 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
               ,0x100,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_d0,&local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d0);
    if ((long *)CONCAT44(local_c8.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         local_c8.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_c8.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     local_c8.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_4_) + 8))();
    }
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (!bVar4) goto LAB_0010fb1f;
  local_d0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x147416;
  testing::ContainsRegex<char_const*>
            ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)&local_c8,
             (testing *)&local_d0,regex_01);
  testing::PolymorphicMatcher::operator_cast_to_Matcher
            ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              *)&local_a8,(PolymorphicMatcher *)&local_c8);
  if (local_c0[0] != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0[0]);
  }
  bVar4 = testing::internal::DeathTest::Create
                    ("remove_warning = row.at(5)",
                     (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                      *)&local_a8,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
                     ,0x101,(DeathTest **)&local_d8);
  testing::internal::
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~MatcherBase(&local_a8);
  AVar2.data_ = local_d8.data_;
  iVar7 = 6;
  if (bVar4) {
    if (local_d8.data_ != (AssertHelperData *)0x0) {
      iVar7 = (**(code **)(*(long *)local_d8.data_ + 0x10))(local_d8.data_);
      AVar3.data_ = local_d8.data_;
      if (iVar7 == 0) {
        iVar7 = (**(code **)(*(long *)local_d8.data_ + 0x18))(local_d8.data_);
        bVar4 = testing::internal::ExitedUnsuccessfully(iVar7);
        cVar6 = (**(code **)(*(long *)local_d8.data_ + 0x20))(local_d8.data_,bVar4);
        if (cVar6 != '\0') goto LAB_0010fb08;
        iVar7 = 6;
        bVar4 = false;
      }
      else {
        if (iVar7 == 1) {
          bVar4 = testing::internal::AlwaysTrue();
          if (bVar4) {
            local_c8.ss_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._0_4_ = 5;
            Disa::Matrix_Sparse_Row<double,_int>::at(&local_60,(index_type *)&local_c8);
          }
          (**(code **)(*(long *)local_d8.data_ + 0x28))(local_d8.data_,2);
          (**(code **)(*(long *)AVar3.data_ + 0x28))(AVar3.data_,0);
        }
LAB_0010fb08:
        iVar7 = 0;
        bVar4 = true;
      }
      (**(code **)(*(long *)AVar2.data_ + 8))(AVar2.data_);
      if (!bVar4) goto LAB_0010fb1b;
    }
    iVar7 = 0;
  }
LAB_0010fb1b:
  if (iVar7 == 0) {
    return;
  }
LAB_0010fb1f:
  testing::Message::Message(&local_c8);
  pcVar9 = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_d0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
             ,0x101,pcVar9);
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_d0,&local_c8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d0);
  if ((long *)CONCAT44(local_c8.ss_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl._4_4_,
                       local_c8.ss_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl._0_4_) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT44(local_c8.ss_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl._4_4_,
                                   local_c8.ss_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl._0_4_) + 8))();
  }
  return;
}

Assistant:

TEST_F(matrix_sparse_row_test, at) {
  Matrix_Sparse_Row<double, int> row(&csr_data, csr_data.row_offset.begin() + 2);

  EXPECT_DOUBLE_EQ(row.at(1), 3.0);
  EXPECT_DOUBLE_EQ(row.at(3), 4.0);
  EXPECT_DOUBLE_EQ(row.at(4), 5.0);

  double remove_warning = 0;
  EXPECT_DEATH(remove_warning = row.at(0), "./*");
  EXPECT_DEATH(remove_warning = row.at(2), "./*");
  EXPECT_DEATH(remove_warning = row.at(5), "./*");
}